

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O0

bool __thiscall
ImPlot::RectRenderer<ImPlot::GetterHeatmap<unsigned_long_long>,_ImPlot::TransformerLinLog>::
operator()(RectRenderer<ImPlot::GetterHeatmap<unsigned_long_long>,_ImPlot::TransformerLinLog> *this,
          ImDrawList *DrawList,ImRect *cull_rect,ImVec2 *uv,int prim)

{
  bool bVar1;
  byte local_91;
  ImVec2 local_90;
  ImVec2 local_88;
  ImRect local_80;
  ImVec2 local_70;
  ImVec2 P2;
  ImVec2 P1;
  RectInfo rect;
  int prim_local;
  ImVec2 *uv_local;
  ImRect *cull_rect_local;
  ImDrawList *DrawList_local;
  RectRenderer<ImPlot::GetterHeatmap<unsigned_long_long>,_ImPlot::TransformerLinLog> *this_local;
  
  rect._36_4_ = prim;
  GetterHeatmap<unsigned_long_long>::operator()((RectInfo *)&P1,this->Getter,prim);
  P2 = TransformerLinLog::operator()(this->Transformer,(ImPlotPoint *)&P1);
  local_70 = TransformerLinLog::operator()(this->Transformer,(ImPlotPoint *)&rect.Min.y);
  local_91 = 1;
  if ((rect.Max.y._0_4_ & 0xff000000) != 0) {
    local_88 = ImMin(&P2,&local_70);
    local_90 = ImMax(&P2,&local_70);
    ImRect::ImRect(&local_80,&local_88,&local_90);
    bVar1 = ImRect::Overlaps(cull_rect,&local_80);
    local_91 = bVar1 ^ 0xff;
  }
  bVar1 = (local_91 & 1) == 0;
  if (bVar1) {
    DrawList->_VtxWritePtr->pos = P2;
    DrawList->_VtxWritePtr->uv = *uv;
    DrawList->_VtxWritePtr->col = rect.Max.y._0_4_;
    DrawList->_VtxWritePtr[1].pos.x = P2.x;
    DrawList->_VtxWritePtr[1].pos.y = local_70.y;
    DrawList->_VtxWritePtr[1].uv = *uv;
    DrawList->_VtxWritePtr[1].col = rect.Max.y._0_4_;
    DrawList->_VtxWritePtr[2].pos = local_70;
    DrawList->_VtxWritePtr[2].uv = *uv;
    DrawList->_VtxWritePtr[2].col = rect.Max.y._0_4_;
    DrawList->_VtxWritePtr[3].pos.x = local_70.x;
    DrawList->_VtxWritePtr[3].pos.y = P2.y;
    DrawList->_VtxWritePtr[3].uv = *uv;
    DrawList->_VtxWritePtr[3].col = rect.Max.y._0_4_;
    DrawList->_VtxWritePtr = DrawList->_VtxWritePtr + 4;
    *DrawList->_IdxWritePtr = (ImDrawIdx)DrawList->_VtxCurrentIdx;
    DrawList->_IdxWritePtr[1] = (short)DrawList->_VtxCurrentIdx + 1;
    DrawList->_IdxWritePtr[2] = (short)DrawList->_VtxCurrentIdx + 3;
    DrawList->_IdxWritePtr[3] = (short)DrawList->_VtxCurrentIdx + 1;
    DrawList->_IdxWritePtr[4] = (short)DrawList->_VtxCurrentIdx + 2;
    DrawList->_IdxWritePtr[5] = (short)DrawList->_VtxCurrentIdx + 3;
    DrawList->_IdxWritePtr = DrawList->_IdxWritePtr + 6;
    DrawList->_VtxCurrentIdx = DrawList->_VtxCurrentIdx + 4;
  }
  return bVar1;
}

Assistant:

inline bool operator()(ImDrawList& DrawList, const ImRect& cull_rect, const ImVec2& uv, int prim) const {
        RectInfo rect = Getter(prim);
        ImVec2 P1 = Transformer(rect.Min);
        ImVec2 P2 = Transformer(rect.Max);

        if ((rect.Color & IM_COL32_A_MASK) == 0 || !cull_rect.Overlaps(ImRect(ImMin(P1, P2), ImMax(P1, P2))))
            return false;

        DrawList._VtxWritePtr[0].pos   = P1;
        DrawList._VtxWritePtr[0].uv    = uv;
        DrawList._VtxWritePtr[0].col   = rect.Color;
        DrawList._VtxWritePtr[1].pos.x = P1.x;
        DrawList._VtxWritePtr[1].pos.y = P2.y;
        DrawList._VtxWritePtr[1].uv    = uv;
        DrawList._VtxWritePtr[1].col   = rect.Color;
        DrawList._VtxWritePtr[2].pos   = P2;
        DrawList._VtxWritePtr[2].uv    = uv;
        DrawList._VtxWritePtr[2].col   = rect.Color;
        DrawList._VtxWritePtr[3].pos.x = P2.x;
        DrawList._VtxWritePtr[3].pos.y = P1.y;
        DrawList._VtxWritePtr[3].uv    = uv;
        DrawList._VtxWritePtr[3].col   = rect.Color;
        DrawList._VtxWritePtr += 4;
        DrawList._IdxWritePtr[0] = (ImDrawIdx)(DrawList._VtxCurrentIdx);
        DrawList._IdxWritePtr[1] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 1);
        DrawList._IdxWritePtr[2] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 3);
        DrawList._IdxWritePtr[3] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 1);
        DrawList._IdxWritePtr[4] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 2);
        DrawList._IdxWritePtr[5] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 3);
        DrawList._IdxWritePtr   += 6;
        DrawList._VtxCurrentIdx += 4;
        return true;
    }